

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O1

int anon_unknown.dwarf_12323::RtMidiIn_dtor(lua_State *L)

{
  RtMidiIn *pRVar1;
  iterator __position;
  key_type local_28;
  
  pRVar1 = (RtMidiIn *)lua_touserdata(L,1);
  if (pRVar1 != (RtMidiIn *)0x0) {
    local_28.first = pRVar1;
    local_28.second = L;
    __position = std::
                 _Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                 ::find((_Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidiIn_callbacks,&local_28);
    if (__position._M_node != (_Base_ptr)((anonymous_namespace)::RtMidiIn_callbacks + 8)) {
      luaL_unref(L,0xffffd8f0,*(undefined4 *)&__position._M_node[1]._M_left);
      std::
      _Rb_tree<std::pair<RtMidiIn*,lua_State*>,std::pair<std::pair<RtMidiIn*,lua_State*>const,int>,std::_Select1st<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>,std::less<std::pair<RtMidiIn*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<RtMidiIn*,lua_State*>,std::pair<std::pair<RtMidiIn*,lua_State*>const,int>,std::_Select1st<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>,std::less<std::pair<RtMidiIn*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>>
                          *)(anonymous_namespace)::RtMidiIn_callbacks,__position);
    }
    (*(pRVar1->super_RtMidi)._vptr_RtMidi[7])(pRVar1);
  }
  return 0;
}

Assistant:

int RtMidiIn_dtor(lua_State *L) {
	auto midiin = reinterpret_cast<RtMidiIn *>(lua_touserdata(L, 1));
	if (midiin) {
		auto it = RtMidiIn_callbacks.find({midiin, L});
		if (it != RtMidiIn_callbacks.end()) {
			luaL_unref(L, LUA_REGISTRYINDEX, it->second);
			RtMidiIn_callbacks.erase(it);
		}
		midiin->~RtMidiIn();
	}
	return 0;
}